

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

void __thiscall
data_structures::Matrix<double>::Matrix(Matrix<double> *this,size_t rows,size_t columns)

{
  size_t columns_local;
  size_t rows_local;
  Matrix<double> *this_local;
  
  this->rows_ = rows;
  this->columns_ = columns;
  std::vector<double,_std::allocator<double>_>::vector(&this->data_);
  std::vector<double,_std::allocator<double>_>::resize(&this->data_,this->rows_ * this->columns_);
  return;
}

Assistant:

Matrix<ElementType>::Matrix(size_t rows, size_t columns)
  : rows_(rows), columns_(columns)
{
  data_.resize(rows_ * columns_);
}